

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.cpp
# Opt level: O0

atom * arc::vector_to_atom(atom *__return_storage_ptr__,
                          vector<arc::atom,_std::allocator<arc::atom>_> *a,int start)

{
  size_type sVar1;
  const_reference car_val;
  atom local_48;
  int local_24;
  undefined1 local_1d;
  int i;
  vector<arc::atom,_std::allocator<arc::atom>_> *pvStack_18;
  int start_local;
  vector<arc::atom,_std::allocator<arc::atom>_> *a_local;
  atom *r;
  
  local_1d = 0;
  i = start;
  pvStack_18 = a;
  a_local = (vector<arc::atom,_std::allocator<arc::atom>_> *)__return_storage_ptr__;
  atom::atom(__return_storage_ptr__,(atom *)nil);
  sVar1 = std::vector<arc::atom,_std::allocator<arc::atom>_>::size(pvStack_18);
  local_24 = (int)sVar1;
  while (local_24 = local_24 + -1, i <= local_24) {
    car_val = std::vector<arc::atom,_std::allocator<arc::atom>_>::operator[]
                        (pvStack_18,(long)local_24);
    make_cons(&local_48,car_val,__return_storage_ptr__);
    atom::operator=(__return_storage_ptr__,&local_48);
    atom::~atom(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

atom vector_to_atom(const vector<atom>& a, int start) {
		atom r = nil;
		int i;
		for (i = a.size() - 1; i >= start; i--) {
			r = make_cons(a[i], r);
		}
		return r;
	}